

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_result_value(jx9_context *pCtx,jx9_value *pValue)

{
  sxi32 local_1c;
  int rc;
  jx9_value *pValue_local;
  jx9_context *pCtx_local;
  
  local_1c = 0;
  if (pValue == (jx9_value *)0x0) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    local_1c = jx9MemObjStore(pValue,pCtx->pRet);
  }
  return local_1c;
}

Assistant:

JX9_PRIVATE int jx9_result_value(jx9_context *pCtx, jx9_value *pValue)
{
	int rc = JX9_OK;
	if( pValue == 0 ){
		jx9MemObjRelease(pCtx->pRet);
	}else{
		rc = jx9MemObjStore(pValue, pCtx->pRet);
	}
	return rc;
}